

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_rollback_write.c
# Opt level: O2

void zip_source_rollback_write(zip_source_t *src)

{
  if (src->src != (zip_source_t *)0x0) {
    return;
  }
  if (src->write_state - ZIP_SOURCE_WRITE_OPEN < 2) {
    _zip_source_call(src,(void *)0x0,0,ZIP_SOURCE_ROLLBACK_WRITE);
    src->write_state = ZIP_SOURCE_WRITE_CLOSED;
  }
  return;
}

Assistant:

ZIP_EXTERN void
zip_source_rollback_write(zip_source_t *src) {
    if (ZIP_SOURCE_IS_LAYERED(src)) {
        return;
    }

    if (src->write_state != ZIP_SOURCE_WRITE_OPEN && src->write_state != ZIP_SOURCE_WRITE_FAILED) {
        return;
    }

    _zip_source_call(src, NULL, 0, ZIP_SOURCE_ROLLBACK_WRITE);
    src->write_state = ZIP_SOURCE_WRITE_CLOSED;
}